

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O1

Mpm_Man_t * Mpm_ManStart(Mig_Man_t *pMig,Mpm_Par_t *pPars)

{
  Mpm_LibLut_t *pMVar1;
  Mpm_Par_t *pMVar2;
  bool bVar3;
  uint uVar4;
  Mpm_Man_t *p;
  Mmr_Step_t *pMVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int *piVar8;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar9;
  int iVar10;
  abctime aVar11;
  uint uVar12;
  int iVar13;
  size_t __size;
  uint uVar14;
  Mpm_Uni_t *pMVar15;
  word *pEntry;
  ulong uVar16;
  long lVar17;
  long lVar18;
  timespec ts;
  timespec local_40;
  
  if (0x20 < pPars->nNumCuts) {
    __assert_fail("pPars->nNumCuts <= MPM_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMan.c"
                  ,0x32,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseTruth != 0) && (0x10 < pPars->pLib->LutMax)) {
    __assert_fail("!pPars->fUseTruth || pPars->pLib->LutMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMan.c"
                  ,0x33,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseDsd != 0) && (6 < pPars->pLib->LutMax)) {
    __assert_fail("!pPars->fUseDsd || pPars->pLib->LutMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMan.c"
                  ,0x34,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  Mig_ManSetRefs(pMig);
  p = (Mpm_Man_t *)calloc(1,0x3688);
  p->pMig = pMig;
  p->pPars = pPars;
  pMVar1 = pPars->pLib;
  p->pLibLut = pMVar1;
  iVar10 = pMVar1->LutMax;
  p->nLutSize = iVar10;
  iVar13 = 1 << ((char)iVar10 - 6U & 0x1f);
  if (iVar10 < 7) {
    iVar13 = 1;
  }
  if (pPars->fUseTruth == 0) {
    iVar13 = 0;
  }
  p->nTruWords = iVar13;
  iVar13 = pPars->nNumCuts;
  p->nNumCuts = iVar13;
  uVar14 = (uint)((long)(iVar10 << 2) + 0xcU >> 3);
  uVar12 = uVar14 + 1;
  if (1 < uVar12) {
    if (uVar14 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar12 = (uVar12 ^ 0xffffffe0) + 0x21;
    }
  }
  uVar14 = 1 << ((byte)uVar12 & 0x1f);
  uVar16 = 1;
  pMVar5 = (Mmr_Step_t *)calloc((long)(int)uVar14 * 0x38 + 0x18,1);
  pMVar5->nBits = uVar12;
  pMVar5->uMask = uVar14 - 1;
  if (1 < (int)uVar14) {
    piVar8 = &pMVar5[3].nEntriesAll;
    do {
      if (uVar16 == 0x2000) {
        __assert_fail("nEntryWords > 0 && nEntryWords < (1 << nPageBase)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0x96,"void Mmr_FixedCreate(Mmr_Fixed_t *, int, int)");
      }
      *(undefined8 *)(piVar8 + -2) = 0x1fff0000000d;
      *piVar8 = (int)uVar16;
      uVar16 = uVar16 + 1;
      piVar8 = piVar8 + 0xe;
    } while (uVar14 != uVar16);
  }
  p->pManCuts = pMVar5;
  if ((p->vFreeUnits).nCap <= iVar13) {
    ppvVar6 = (p->vFreeUnits).pArray;
    __size = ((long)iVar13 + 1) * 8;
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc(__size);
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,__size);
    }
    (p->vFreeUnits).pArray = ppvVar6;
    (p->vFreeUnits).nCap = (int)((long)iVar13 + 1);
  }
  lVar17 = (long)p->nNumCuts;
  if (-1 < lVar17) {
    pMVar15 = p->pCutUnits + lVar17;
    lVar17 = lVar17 + 1;
    do {
      uVar14 = (p->vFreeUnits).nCap;
      if ((p->vFreeUnits).nSize == uVar14) {
        if ((int)uVar14 < 0x10) {
          ppvVar6 = (p->vFreeUnits).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,0x80);
          }
          (p->vFreeUnits).pArray = ppvVar6;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar14 * 2;
          if (iVar10 <= (int)uVar14) goto LAB_00479fbd;
          ppvVar6 = (p->vFreeUnits).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar14 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar14 << 4);
          }
          (p->vFreeUnits).pArray = ppvVar6;
        }
        (p->vFreeUnits).nCap = iVar10;
      }
LAB_00479fbd:
      iVar10 = (p->vFreeUnits).nSize;
      (p->vFreeUnits).nSize = iVar10 + 1;
      (p->vFreeUnits).pArray[iVar10] = pMVar15;
      pMVar15 = pMVar15 + -1;
      lVar18 = lVar17 + -1;
      bVar3 = 0 < lVar17;
      lVar17 = lVar18;
    } while (lVar18 != 0 && bVar3);
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar6;
  p->vTemp = pVVar7;
  uVar14 = pMig->nObjs;
  if ((p->vCutBests).nCap < (int)uVar14) {
    piVar8 = (p->vCutBests).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vCutBests).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vCutBests).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vCutBests).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vCutBests).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vCutLists).nCap < (int)uVar14) {
    piVar8 = (p->vCutLists).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vCutLists).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vCutLists).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vCutLists).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vCutLists).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vMigRefs).nCap < (int)uVar14) {
    piVar8 = (p->vMigRefs).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vMigRefs).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vMigRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vMigRefs).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vMigRefs).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vMapRefs).nCap < (int)uVar14) {
    piVar8 = (p->vMapRefs).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vMapRefs).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vMapRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vMapRefs).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vMapRefs).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vEstRefs).nCap < (int)uVar14) {
    piVar8 = (p->vEstRefs).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vEstRefs).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vEstRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vEstRefs).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vEstRefs).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vRequireds).nCap < (int)uVar14) {
    piVar8 = (p->vRequireds).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vRequireds).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vRequireds).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    piVar8 = (p->vRequireds).pArray;
    uVar16 = 0;
    do {
      piVar8[uVar16] = 1000000000;
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  (p->vRequireds).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vTimes).nCap < (int)uVar14) {
    piVar8 = (p->vTimes).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vTimes).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vTimes).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vTimes).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vTimes).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vAreas).nCap < (int)uVar14) {
    piVar8 = (p->vAreas).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vAreas).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0047a5c7;
    (p->vAreas).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vAreas).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vAreas).nSize = uVar14;
  uVar14 = pMig->nObjs;
  if ((p->vEdges).nCap < (int)uVar14) {
    piVar8 = (p->vEdges).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
    }
    (p->vEdges).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_0047a5c7:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vEdges).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vEdges).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vEdges).nSize = uVar14;
  pMVar2 = p->pPars;
  if (pMVar2->fUseTruth == 0) {
LAB_0047a529:
    if (pMVar2->fUseDsd == 0) goto LAB_0047a543;
    Mpm_ManPrecomputePerms(p);
    iVar10 = 1;
  }
  else {
    if (pMVar2->fUseDsd != 0) {
      __assert_fail("!p->pPars->fUseTruth || !p->pPars->fUseDsd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMan.c"
                    ,0x50,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
    }
    if (pMVar2->fUseTruth == 0) goto LAB_0047a529;
    iVar10 = p->nTruWords;
    p_00 = (Vec_Mem_t *)calloc(1,0x30);
    p_00->nEntrySize = iVar10;
    p_00->LogPageSze = 0xc;
    p_00->PageMask = 0xfff;
    p_00->iPage = -1;
    p->vTtMem = p_00;
    if ((p_00->vTable != (Vec_Int_t *)0x0) || (p_00->vNexts != (Vec_Int_t *)0x0)) {
      __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
    }
    uVar14 = 9999;
    while( true ) {
      do {
        uVar12 = uVar14;
        uVar14 = uVar12 + 1;
      } while ((uVar12 & 1) != 0);
      if (uVar14 < 9) break;
      iVar10 = 5;
      while (uVar14 % (iVar10 - 2U) != 0) {
        uVar4 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar14 < uVar4) goto LAB_0047a45e;
      }
    }
LAB_0047a45e:
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    uVar4 = 0x10;
    if (0xe < uVar12) {
      uVar4 = uVar14;
    }
    pVVar9->nSize = 0;
    pVVar9->nCap = uVar4;
    piVar8 = (int *)malloc((long)(int)uVar4 << 2);
    pVVar9->pArray = piVar8;
    pVVar9->nSize = uVar14;
    if (piVar8 != (int *)0x0) {
      memset(piVar8,0xff,(long)(int)uVar14 << 2);
    }
    p_00->vTable = pVVar9;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 10000;
    pVVar9->nSize = 0;
    piVar8 = (int *)malloc(40000);
    pVVar9->pArray = piVar8;
    p_00->vNexts = pVVar9;
    pEntry = p->Truth;
    iVar10 = Vec_MemHashInsert(p_00,pEntry);
    p->funcCst0 = iVar10;
    if (0 < (long)p->nTruWords) {
      memset(pEntry,0xaa,(long)p->nTruWords << 3);
    }
    iVar10 = Vec_MemHashInsert(p->vTtMem,pEntry);
  }
  p->funcVar0 = iVar10;
LAB_0047a543:
  iVar10 = clock_gettime(3,&local_40);
  if (iVar10 < 0) {
    aVar11 = -1;
  }
  else {
    aVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = aVar11;
  pMig->pMan = p;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mpm_Man_t * Mpm_ManStart( Mig_Man_t * pMig, Mpm_Par_t * pPars )
{
    Mpm_Man_t * p;
    int i;
    assert( sizeof(Mpm_Uni_t) % sizeof(word) == 0 );      // aligned info to word boundary
    assert( pPars->nNumCuts <= MPM_CUT_MAX );
    assert( !pPars->fUseTruth || pPars->pLib->LutMax <= 16 );
    assert( !pPars->fUseDsd || pPars->pLib->LutMax <= 6 );
    Mig_ManSetRefs( pMig );
    // alloc
    p = ABC_CALLOC( Mpm_Man_t, 1 );
    p->pMig      = pMig;
    p->pPars     = pPars;
    p->pLibLut   = pPars->pLib;
    p->nLutSize  = pPars->pLib->LutMax;
    p->nTruWords = pPars->fUseTruth ? Abc_Truth6WordNum(p->nLutSize) : 0;
    p->nNumCuts  = pPars->nNumCuts;
    // cuts
    assert( Mpm_CutWordNum(32) < 32 ); // using 5 bits for word count
    p->pManCuts  = Mmr_StepStart( 13, Abc_Base2Log(Mpm_CutWordNum(p->nLutSize) + 1) );
    Vec_PtrGrow( &p->vFreeUnits, p->nNumCuts + 1 );
    for ( i = p->nNumCuts; i >= 0; i-- )
        Vec_PtrPush( &p->vFreeUnits, p->pCutUnits + i );
    p->vTemp     = Vec_PtrAlloc( 1000 );
    // mapping attributes
    Vec_IntFill( &p->vCutBests, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vCutLists, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMigRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMapRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEstRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vRequireds, Mig_ManObjNum(pMig), ABC_INFINITY );
    Vec_IntFill( &p->vTimes, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vAreas, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEdges, Mig_ManObjNum(pMig), 0 );
    // start DSD manager
    assert( !p->pPars->fUseTruth || !p->pPars->fUseDsd );
    if ( p->pPars->fUseTruth )
    { 
        p->vTtMem = Vec_MemAlloc( p->nTruWords, 12 ); // 32 KB/page for 6-var functions
        Vec_MemHashAlloc( p->vTtMem, 10000 );
        p->funcCst0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
        Abc_TtUnit( p->Truth, p->nTruWords, 0 );
        p->funcVar0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
    }
    else if ( p->pPars->fUseDsd )
    {
        Mpm_ManPrecomputePerms( p );
        p->funcVar0 = 1;
    }
    // finish
    p->timeTotal = Abc_Clock();
    pMig->pMan = p;
    return p;
}